

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d9skin.cpp
# Opt level: O0

void * rw::d3d9::skinClose(void *o,int32 param_2,int32 param_3)

{
  int32 param_2_local;
  int32 param_1_local;
  void *o_local;
  
  rw::ObjPipeline::destroy(_DAT_00168c30);
  _DAT_00168c30 = (ObjPipeline *)0x0;
  return o;
}

Assistant:

static void*
skinClose(void *o, int32, int32)
{
#ifdef RW_D3D9
	destroySkinShaders();
#endif

	((ObjPipeline*)skinGlobals.pipelines[PLATFORM_D3D9])->destroy();
	skinGlobals.pipelines[PLATFORM_D3D9] = nil;
	return o;
}